

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LibraryDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax>&,slang::syntax::LibraryIncDirClauseSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *args_3
          ,LibraryIncDirClauseSyntax **args_4,Token *args_5)

{
  Token name;
  Token library;
  Token semi;
  LibraryDeclarationSyntax *this_00;
  
  this_00 = (LibraryDeclarationSyntax *)allocate(this,0xc0,8);
  library.kind = args_1->kind;
  library._2_1_ = args_1->field_0x2;
  library.numFlags.raw = (args_1->numFlags).raw;
  library.rawLen = args_1->rawLen;
  library.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  slang::syntax::LibraryDeclarationSyntax::LibraryDeclarationSyntax
            (this_00,args,library,name,args_3,*args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }